

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_538226::TestPresetExecutionModeHelper
               (ModeEnum *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String local_88;
  String local_68;
  String local_48;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  ModeEnum *out_local;
  
  if (value == (Value *)0x0) {
    out_local._7_1_ = true;
  }
  else {
    local_28 = state;
    state_local = (cmJSONState *)value;
    value_local = (Value *)out;
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_48,(Value *)state_local);
      bVar1 = std::operator==(&local_48,"until-fail");
      std::__cxx11::string::~string((string *)&local_48);
      if (bVar1) {
        *(undefined4 *)&value_local->value_ = 0;
        out_local._7_1_ = true;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_68,(Value *)state_local);
        bVar1 = std::operator==(&local_68,"until-pass");
        std::__cxx11::string::~string((string *)&local_68);
        if (bVar1) {
          *(undefined4 *)&value_local->value_ = 1;
          out_local._7_1_ = true;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_88,(Value *)state_local);
          bVar1 = std::operator==(&local_88,"after-timeout");
          std::__cxx11::string::~string((string *)&local_88);
          if (bVar1) {
            *(undefined4 *)&value_local->value_ = 2;
            out_local._7_1_ = true;
          }
          else {
            cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
            out_local._7_1_ = false;
          }
        }
      }
    }
    else {
      cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool TestPresetExecutionModeHelper(
  TestPreset::ExecutionOptions::RepeatOptions::ModeEnum& out,
  const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "until-fail") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilFail;
    return true;
  }

  if (value->asString() == "until-pass") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::UntilPass;
    return true;
  }

  if (value->asString() == "after-timeout") {
    out = TestPreset::ExecutionOptions::RepeatOptions::ModeEnum::AfterTimeout;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}